

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

Node * makeAction(char *text)

{
  Node *pNVar1;
  char *pcVar2;
  char *pcVar3;
  char name [1024];
  char acStack_418 [1024];
  
  pNVar1 = (Node *)calloc(1,0x38);
  pNVar1->type = 8;
  if (thisRule != (Node *)0x0) {
    actionCount = actionCount + 1;
    sprintf(acStack_418,"_%d_%s",(ulong)(uint)actionCount,(thisRule->rule).name);
    pcVar2 = strdup(acStack_418);
    (pNVar1->action).name = pcVar2;
    pcVar2 = strdup(text);
    (pNVar1->rule).name = pcVar2;
    (pNVar1->rule).variables = actions;
    (pNVar1->action).rule = thisRule;
    actions = pNVar1;
    do {
      while( true ) {
        pcVar3 = pcVar2;
        pcVar2 = pcVar3 + 1;
        if (*pcVar3 != '$') break;
        if (*pcVar2 == '$') {
          pcVar3[0] = 'y';
          pcVar3[1] = 'y';
        }
      }
    } while (*pcVar3 != '\0');
    return pNVar1;
  }
  __assert_fail("thisRule",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                ,0x98,"Node *makeAction(char *)");
}

Assistant:

Node *makeAction(char *text)
{
  Node *node= newNode(Action);
  char name[1024];
  assert(thisRule);
  sprintf(name, "_%d_%s", ++actionCount, thisRule->rule.name);
  node->action.name= strdup(name);
  node->action.text= strdup(text);
  node->action.list= actions;
  node->action.rule= thisRule;
  actions= node;
  {
    char *ptr;
    for (ptr= node->action.text;  *ptr;  ++ptr)
      if ('$' == ptr[0] && '$' == ptr[1])
	ptr[1]= ptr[0]= 'y';
  }
  return node;
}